

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O3

void __thiscall
TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_>::MultAdd
          (TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  SubsList *pSVar1;
  size_t sVar2;
  double object;
  TPZReference *pTVar3;
  TPZFMatrix<float> *pTVar4;
  _func_int **pp_Var5;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  TPZDohrAssembleList<float> *this_00;
  float *pfVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  _List_node_base *p_Var12;
  thread assembleThread;
  TPZAutoPointer<TPZDohrAssembleList<float>_> assemblelist;
  vector<std::thread,_std::allocator<std::thread>_> listThreads;
  TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> multwork;
  TPZSimpleTimer mult;
  int local_224;
  thread local_218;
  TPZFMatrix<float> *local_210;
  float local_204;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_200;
  TPZAutoPointer<TPZDohrAssembly<float>_> local_1f8;
  _List_node_base *local_1f0;
  TPZDohrAssembleList<float> *local_1e8;
  TPZAutoPointer<TPZDohrSubstructCondense<float>_> local_1e0;
  TPZReference *local_1d8;
  TPZFMatrix<float> *local_1d0;
  _func_int **local_1c8;
  TPZFMatrix<float> *local_1c0;
  TPZFMatrix<float> local_1b8;
  undefined1 local_128 [8];
  _List_node_base *local_120;
  __native_type _Stack_118;
  undefined1 local_f0 [8];
  _List_base<TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_>_>_>
  local_e8;
  _List_node_base local_d0 [3];
  undefined8 local_a0;
  undefined1 local_98 [104];
  
  local_210 = z;
  local_204 = alpha;
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)(local_98 + 8));
  if (opt == 0) {
    lVar10 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    if (lVar10 == (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) goto LAB_0148388a;
  }
  else {
    lVar10 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
LAB_0148388a:
    if ((this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow == lVar10) goto LAB_014838a3;
  }
  TPZMatrix<float>::Error("Operator* <matrixs with incompatible dimensions>",(char *)0x0);
LAB_014838a3:
  lVar10 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if ((((lVar10 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
       (lVar10 != (local_210->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol)) ||
      (lVar10 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow,
      lVar10 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) ||
     (lVar10 != (local_210->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<float>::Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  TPZMatrix<float>::PrepareZ(&this->super_TPZMatrix<float>,y,local_210,beta,opt);
  pSVar1 = &this->fGlobal;
  local_1f0 = (_List_node_base *)pSVar1;
  if (this->fNumThreads == 0) {
    p_Var12 = (pSVar1->
              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    local_1c0 = x;
    if (p_Var12 != (_List_node_base *)pSVar1) {
      local_1c8 = (_func_int **)&PTR__TPZVec_01813d70;
      local_224 = 0;
      local_1d0 = (TPZFMatrix<float> *)&PTR__TPZFMatrix_0181dbe8;
      local_1d8 = (TPZReference *)&PTR__TPZManVector_01815498;
      do {
        pTVar4 = local_1d0;
        pTVar3 = local_1d8;
        local_120 = (_List_node_base *)0x0;
        _Stack_118.__align = 0;
        _Stack_118._8_8_ = _Stack_118._8_8_ & 0xffffffffffff0000;
        _Stack_118._16_8_ = 0;
        _Stack_118.__data.__list.__prev = (__pthread_internal_list *)0x0;
        _Stack_118.__data.__list.__next = (__pthread_internal_list *)0x0;
        local_128 = (undefined1  [8])local_1d0;
        TPZVec<int>::TPZVec((TPZVec<int> *)local_f0,0);
        pp_Var5 = local_1c8;
        local_e8._M_impl._M_node.super__List_node_base._M_next = local_d0;
        local_e8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
        local_e8._M_impl._M_node._M_size = 0;
        local_d0[1]._M_prev = (_List_node_base *)local_1c8;
        local_a0 = (__pthread_internal_list *)0x0;
        local_d0[2]._M_next = (_List_node_base *)0x0;
        local_d0[2]._M_prev = (_List_node_base *)0x0;
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_1b8.fSize = 0;
        local_1b8.fElem = (float *)0x0;
        local_1b8.fGiven = (float *)0x0;
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)pTVar4;
        local_f0 = (undefined1  [8])pTVar3;
        TPZVec<int>::TPZVec(&local_1b8.fPivot.super_TPZVec<int>,0);
        local_1b8.fPivot.super_TPZVec<int>.fStore = local_1b8.fPivot.fExtAlloc;
        local_1b8.fPivot.super_TPZVec<int>.fNElements = 0;
        local_1b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_1b8.fWork._vptr_TPZVec = pp_Var5;
        local_1b8.fWork.fStore = (float *)0x0;
        local_1b8.fWork.fNElements = 0;
        local_1b8.fWork.fNAlloc = 0;
        local_1b8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)pTVar3;
        TPZDohrAssembly<float>::Extract
                  (((this->fAssembly).fRef)->fPointer,local_224,local_1c0,
                   (TPZFMatrix<float> *)local_128);
        uVar7 = _Stack_118.__align;
        p_Var6 = local_120;
        uVar11 = _Stack_118.__align * (long)local_120;
        pfVar8 = local_1b8.fElem;
        if (uVar11 - local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol *
                     local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow != 0) {
          if (local_1b8.fElem != local_1b8.fGiven && local_1b8.fElem != (float *)0x0) {
            operator_delete__(local_1b8.fElem);
          }
          if ((local_1b8.fGiven == (float *)0x0) ||
             (pfVar8 = local_1b8.fGiven,
             uVar11 - local_1b8.fSize != 0 && local_1b8.fSize <= (long)uVar11)) {
            if (uVar11 == 0) {
              pfVar8 = (float *)0x0;
            }
            else {
              pfVar8 = (float *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 * 4);
            }
          }
        }
        local_1b8.fElem = pfVar8;
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (int64_t)p_Var6;
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = uVar7;
        (*local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0xf])(&local_1b8);
        TPZDohrSubstructCondense<float>::ContributeKULocal
                  ((TPZDohrSubstructCondense<float> *)(p_Var12[1]._M_next)->_M_next,local_204,
                   (TPZFMatrix<float> *)local_128,&local_1b8);
        TPZDohrAssembly<float>::Assemble
                  (((this->fAssembly).fRef)->fPointer,local_224,&local_1b8,local_210);
        TPZFMatrix<float>::~TPZFMatrix(&local_1b8);
        TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)local_128);
        local_224 = local_224 + 1;
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != local_1f0);
    }
  }
  else {
    sVar2 = (this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
            ._M_impl._M_node._M_size;
    this_00 = (TPZDohrAssembleList<float> *)operator_new(0xe0);
    local_1f8.fRef = (this->fAssembly).fRef;
    LOCK();
    ((local_1f8.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_1f8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<float>::TPZDohrAssembleList(this_00,(int)sVar2,local_210,&local_1f8);
    local_200.fRef = (TPZReference *)operator_new(0x10);
    ((local_200.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
    (local_200.fRef)->fPointer = this_00;
    LOCK();
    ((local_200.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer(&local_1f8);
    local_f0 = (undefined1  [8])(this->fAssembly).fRef;
    LOCK();
    (((TPZReference *)local_f0)->fCounter).super___atomic_base<int>._M_i =
         (((TPZReference *)local_f0)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e8;
    local_120 = (_List_node_base *)CONCAT44(local_120._4_4_,local_204);
    _Stack_118.__align = 0;
    _Stack_118._8_8_ = 0;
    _Stack_118._16_8_ = 0;
    _Stack_118.__data.__list.__prev = (__pthread_internal_list *)0x0;
    iVar9 = 0;
    _Stack_118.__data.__list.__next = (__pthread_internal_list *)0x0;
    LOCK();
    (((TPZReference *)local_f0)->fCounter).super___atomic_base<int>._M_i =
         (((TPZReference *)local_f0)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e8._M_impl._M_node._M_size = 0;
    local_d0[0]._M_next = (_List_node_base *)local_200.fRef;
    LOCK();
    ((local_200.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_200.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_128 = (undefined1  [8])x;
    local_e8._M_impl._M_node.super__List_node_base._M_prev =
         local_e8._M_impl._M_node.super__List_node_base._M_next;
    local_98._0_8_ = local_f0;
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)local_98);
    p_Var12 = (this->fGlobal).
              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var12 != (_List_node_base *)pSVar1) {
      do {
        local_1e0.fRef = (TPZReference *)p_Var12[1]._M_next;
        LOCK();
        *(int *)&((_List_node_base *)local_1e0.fRef)->_M_prev =
             *(int *)&((_List_node_base *)local_1e0.fRef)->_M_prev + 1;
        UNLOCK();
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_
             = iVar9;
        LOCK();
        *(int *)&((_List_node_base *)local_1e0.fRef)->_M_prev =
             *(int *)&((_List_node_base *)local_1e0.fRef)->_M_prev + 1;
        UNLOCK();
        local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (int64_t)local_1e0.fRef;
        TPZAutoPointer<TPZDohrSubstructCondense<float>_>::~TPZAutoPointer(&local_1e0);
        TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::AddItem
                  ((TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *)local_128,
                   (TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_> *)&local_1b8);
        TPZAutoPointer<TPZDohrSubstructCondense<float>_>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)
                   &local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow);
        iVar9 = iVar9 + 1;
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != local_1f0);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&local_1b8,
               (long)this->fNumThreads,(allocator_type *)&local_218);
    if (0 < this->fNumThreads) {
      lVar10 = 0;
      do {
        local_1e8 = (TPZDohrAssembleList<float> *)local_128;
        std::thread::
        thread<void*(&)(void*),TPZDohrThreadMultList<float,TPZDohrSubstructCondense<float>>*,void>
                  (&local_218,
                   TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::ThreadWork,
                   (TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> **)&local_1e8);
        if (local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [lVar10] != (_func_int *)0x0) goto LAB_01483e45;
        ((id *)(local_1b8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable + lVar10))->_M_thread =
             (native_handle_type)local_218._M_id._M_thread;
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->fNumThreads);
    }
    local_1e8 = (local_200.fRef)->fPointer;
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<float>*,void>
              (&local_218,TPZDohrAssembleList<float>::Assemble,&local_1e8);
    std::thread::join();
    if (0 < this->fNumThreads) {
      lVar10 = 0;
      do {
        std::thread::join();
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->fNumThreads);
    }
    if (local_218._M_id._M_thread != 0) {
LAB_01483e45:
      std::terminate();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&local_1b8);
    TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<float>_> *)local_d0);
    std::__cxx11::
    _List_base<TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_>_>_>
    ::_M_clear(&local_e8);
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<float>_> *)local_f0);
    TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer(&local_200);
  }
  object = TPZSimpleTimer::ReturnTimeDouble((TPZSimpleTimer *)(local_98 + 8));
  TPZStack<double,_10>::Push(&tempo.fMultiply,object);
  TPZSimpleTimer::~TPZSimpleTimer((TPZSimpleTimer *)(local_98 + 8));
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
											 const TVar alpha,const TVar beta,const int opt) const
{
    
#ifdef USING_TBB 
        MultAddTBB(x, y, z, alpha, beta, opt);
        return;
#endif
        
	TPZSimpleTimer mult;
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrixs with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);
	
	typename SubsList::const_iterator iter;
	int isub = 0;
	if (fNumThreads == 0) {
		for (iter=fGlobal.begin();iter!=fGlobal.end();iter++,isub++) {
            if(0)
            {
                TPZPersistenceManager::OpenWrite("dohr.txt");
                TPZPersistenceManager::WriteToFile(fAssembly.operator ->());
                TPZPersistenceManager::WriteToFile(&x);
                TPZAutoPointer<TSubStruct> point(*iter);
                TPZPersistenceManager::WriteToFile(point.operator ->());
                TPZPersistenceManager::CloseWrite();
                
            }
			TPZFMatrix<TVar> xlocal,zlocal;
			fAssembly->Extract(isub,x,xlocal);
			zlocal.Redim(xlocal.Rows(),xlocal.Cols());
			(*iter)->ContributeKULocal(alpha,xlocal,zlocal);
			fAssembly->Assemble(isub,zlocal,z);
			//         z.Print("Resultado intermediario");
		}		
	}
	else {
        unsigned int nglob = fGlobal.size();
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(nglob,z,this->fAssembly);
		
		TPZDohrThreadMultList<TVar,TSubStruct> multwork(x,alpha,fAssembly,assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator iter;
		int isub=0;
		for (iter=fGlobal.begin(); iter!=fGlobal.end(); iter++,isub++) {
			TPZDohrThreadMultData<TSubStruct> data(isub,*iter);
            
            multwork.AddItem(data);
		}
		std::vector<std::thread> listThreads(fNumThreads);
        int i;
        for (i = 0; i < fNumThreads; i++) {
              listThreads[i] = std::thread(TPZDohrThreadMultList<TVar,TSubStruct>::ThreadWork, &multwork);
        }
        std::thread assembleThread(TPZDohrAssembleList<TVar>::Assemble, assemblelist.operator->());
        assembleThread.join();
        for (i = 0; i < fNumThreads; i++) {
          listThreads[i].join();
        }
	}
	tempo.fMultiply.Push(mult.ReturnTimeDouble());
}